

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSystem.cpp
# Opt level: O2

void __thiscall
iDynTree::optimalcontrol::LinearSystem::LinearSystem
          (LinearSystem *this,size_t stateSize,size_t controlSize,SparsityStructure *stateSparsity,
          SparsityStructure *controlSparsity)

{
  bool bVar1;
  LinearSystemPimpl *pLVar2;
  MatrixDynSize *pMVar3;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> tempControl;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> tempState;
  __shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
  local_50;
  __shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
  local_40;
  
  DynamicalSystem::DynamicalSystem(&this->super_DynamicalSystem,stateSize,controlSize);
  (this->super_DynamicalSystem)._vptr_DynamicalSystem = (_func_int **)&PTR__LinearSystem_001d3808;
  pLVar2 = (LinearSystemPimpl *)operator_new(0xf8);
  memset(pLVar2,0,0xf8);
  LinearSystemPimpl::LinearSystemPimpl(pLVar2);
  this->m_pimpl = pLVar2;
  std::make_shared<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>>();
  pMVar3 = TimeInvariantObject<iDynTree::MatrixDynSize>::get(local_40._M_ptr);
  iDynTree::MatrixDynSize::resize((ulong)pMVar3,stateSize & 0xffffffff);
  TimeInvariantObject<iDynTree::MatrixDynSize>::get(local_40._M_ptr);
  iDynTree::MatrixDynSize::zero();
  std::
  __shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,(__gnu_cxx::_Lock_policy)2>
  ::operator=((__shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,(__gnu_cxx::_Lock_policy)2>
               *)this->m_pimpl,&local_40);
  std::make_shared<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>>();
  pMVar3 = TimeInvariantObject<iDynTree::MatrixDynSize>::get(local_50._M_ptr);
  iDynTree::MatrixDynSize::resize((ulong)pMVar3,stateSize & 0xffffffff);
  TimeInvariantObject<iDynTree::MatrixDynSize>::get(local_50._M_ptr);
  iDynTree::MatrixDynSize::zero();
  std::
  __shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,(__gnu_cxx::_Lock_policy)2>
  ::operator=((__shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,(__gnu_cxx::_Lock_policy)2>
               *)&this->m_pimpl->controlMatrix,&local_50);
  pLVar2 = this->m_pimpl;
  pLVar2->hasStateSparsity = false;
  pLVar2->hasControlSparsity = false;
  bVar1 = SparsityStructure::isValid(stateSparsity);
  if (bVar1) {
    pLVar2 = this->m_pimpl;
    pLVar2->hasStateSparsity = true;
    SparsityStructure::operator=(&pLVar2->stateSparsity,stateSparsity);
  }
  bVar1 = SparsityStructure::isValid(controlSparsity);
  if (bVar1) {
    pLVar2 = this->m_pimpl;
    pLVar2->hasControlSparsity = true;
    SparsityStructure::operator=(&pLVar2->controlSparsity,controlSparsity);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return;
}

Assistant:

LinearSystem::LinearSystem(size_t stateSize, size_t controlSize, const SparsityStructure &stateSparsity, const SparsityStructure &controlSparsity)
            : DynamicalSystem(stateSize, controlSize)
            , m_pimpl(new LinearSystemPimpl())
        {
            assert(m_pimpl);
            std::shared_ptr<TimeInvariantMatrix> tempState = std::make_shared<TimeInvariantMatrix>();
            tempState->get().resize(static_cast<unsigned int>(stateSize), static_cast<unsigned int>(stateSize));
            tempState->get().zero();
            m_pimpl->stateMatrix = tempState;

            std::shared_ptr<TimeInvariantMatrix> tempControl = std::make_shared<TimeInvariantMatrix>();
            tempControl->get().resize(static_cast<unsigned int>(stateSize), static_cast<unsigned int>(controlSize));
            tempControl->get().zero();
            m_pimpl->controlMatrix = tempControl;

            m_pimpl->hasStateSparsity = false;
            m_pimpl->hasControlSparsity = false;
            if (stateSparsity.isValid()) {
                m_pimpl->hasStateSparsity = true;
                m_pimpl->stateSparsity = stateSparsity;
            }
            if (controlSparsity.isValid()) {
                m_pimpl->hasControlSparsity = true;
                m_pimpl->controlSparsity = controlSparsity;
            }
        }